

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_query.cpp
# Opt level: O0

int __thiscall
cmakels::cmake_query::cmake_query::configure(cmake_query *this,path *cmake_query_build_dir)

{
  undefined8 __lhs;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  pointer pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  string local_108;
  string local_e8;
  path local_c8;
  undefined1 local_a0 [8];
  path dst;
  path local_68;
  undefined1 local_40 [8];
  path cmake_cache_src;
  path *cmake_query_build_dir_local;
  cmake_query *this_local;
  
  cmake_cache_src._32_8_ = cmake_query_build_dir;
  std::filesystem::__cxx11::path::path<char[15],std::filesystem::__cxx11::path>
            (&local_68,(char (*) [15])0x8b38dc,auto_format);
  std::filesystem::__cxx11::operator/((path *)local_40,&this->build_dir_,&local_68);
  std::filesystem::__cxx11::path::~path(&local_68);
  std::filesystem::create_directories((path *)cmake_cache_src._32_8_);
  bVar1 = std::filesystem::exists((path *)local_40);
  __lhs = cmake_cache_src._32_8_;
  if (bVar1) {
    std::filesystem::__cxx11::path::path<char[15],std::filesystem::__cxx11::path>
              (&local_c8,(char (*) [15])0x8b38dc,auto_format);
    std::filesystem::__cxx11::operator/((path *)local_a0,(path *)__lhs,&local_c8);
    std::filesystem::__cxx11::path::~path(&local_c8);
    anon_unknown_4::copy_cmake_cache((path *)local_40,(path *)local_a0);
    std::filesystem::__cxx11::path::~path((path *)local_a0);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"No CMakeCache.txt was found at ");
    std::filesystem::__cxx11::path::string(&local_e8,(path *)local_40);
    poVar3 = std::operator<<(poVar3,(string *)&local_e8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  pcVar4 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->my_cmake);
  std::filesystem::__cxx11::path::string(&local_108,(path *)cmake_cache_src._32_8_);
  cmake::SetHomeOutputDirectory(pcVar4,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  pcVar4 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->my_cmake);
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_128);
  iVar2 = cmake::Run(pcVar4,&local_128,false,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  std::filesystem::__cxx11::path::~path((path *)local_40);
  return iVar2;
}

Assistant:

int cmake_query::configure(fs::path const &cmake_query_build_dir) {
  fs::path cmake_cache_src{build_dir_ / "CMakeCache.txt"};
  fs::create_directories(cmake_query_build_dir);
  if (fs::exists(cmake_cache_src)) {
    auto dst = cmake_query_build_dir / "CMakeCache.txt";
    copy_cmake_cache(cmake_cache_src, dst);
  } else {
    std::cerr << "No CMakeCache.txt was found at " << cmake_cache_src.string()
              << std::endl;
  }
  my_cmake->SetHomeOutputDirectory(cmake_query_build_dir.string());

  return my_cmake->Run(std::vector<std::string>{}, false, true);
}